

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_ManDfsAll(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar1;
  void *Entry;
  int iVar2;
  
  Aig_ManIncrementTravId(p);
  p_00 = Vec_PtrAlloc(p->vObjs->nSize);
  pAVar1 = p->pConst1;
  pAVar1->TravId = p->nTravIds;
  Vec_PtrPush(p_00,pAVar1);
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar2);
    Aig_ManDfsAll_rec(p,pAVar1,p_00);
  }
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    Entry = Vec_PtrEntry(p->vCis,iVar2);
    if (*(int *)((long)Entry + 0x20) != p->nTravIds) {
      Vec_PtrPush(p_00,Entry);
    }
  }
  if (p_00->nSize == p->vObjs->nSize - p->nDeleted) {
    return p_00;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                ,0xf4,"Vec_Ptr_t *Aig_ManDfsAll(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Aig_ManDfsAll( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // add constant
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsAll_rec( p, pObj, vNodes );
    Aig_ManForEachCi( p, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vNodes, pObj );
    assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}